

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.c
# Opt level: O2

uint32_t BrotliBuildSimpleHuffmanTable
                   (HuffmanCode *table,int root_bits,uint16_t *val,uint32_t num_symbols)

{
  ushort uVar1;
  ushort uVar2;
  uint16_t t;
  uint16_t uVar3;
  long lVar4;
  long lVar5;
  uint16_t *puVar6;
  uint32_t uVar7;
  ushort uVar8;
  long lVar9;
  ulong uVar10;
  
  uVar10 = 1;
  uVar7 = 1 << ((byte)root_bits & 0x1f);
  switch(num_symbols) {
  case 0:
    table->bits = '\0';
    table->value = *val;
    break;
  case 1:
    table->bits = '\x01';
    table[1].bits = '\x01';
    if (*val < val[1]) {
      table->value = *val;
      uVar3 = val[1];
    }
    else {
      table->value = val[1];
      uVar3 = *val;
    }
    table[1].value = uVar3;
    uVar10 = 2;
    break;
  case 2:
    table->bits = '\x01';
    uVar3 = *val;
    table->value = uVar3;
    table[2].bits = '\x01';
    table[2].value = uVar3;
    uVar1 = val[2];
    uVar2 = val[1];
    uVar8 = uVar2;
    if (uVar1 < uVar2) {
      uVar8 = uVar1;
    }
    puVar6 = val + 1;
    if (uVar2 < uVar1) {
      puVar6 = val + 2;
    }
    table[1].value = uVar8;
    table[3].value = *puVar6;
    table[1].bits = '\x02';
    table[3].bits = '\x02';
    uVar10 = 4;
    break;
  case 3:
    lVar4 = 1;
    for (lVar5 = 0; lVar9 = lVar4, lVar5 != 3; lVar5 = lVar5 + 1) {
      for (; lVar9 != 4; lVar9 = lVar9 + 1) {
        uVar1 = val[lVar9];
        if (uVar1 < val[lVar5]) {
          val[lVar9] = val[lVar5];
          val[lVar5] = uVar1;
        }
      }
      lVar4 = lVar4 + 1;
    }
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      table[lVar4].bits = '\x02';
    }
    table->value = *val;
    table[2].value = val[1];
    table[1].value = val[2];
    table[3].value = val[3];
    uVar10 = 4;
    break;
  case 4:
    uVar1 = val[3];
    if (uVar1 < val[2]) {
      val[3] = val[2];
      val[2] = uVar1;
    }
    for (lVar4 = 0; lVar4 != 7; lVar4 = lVar4 + 1) {
      table[lVar4].value = *val;
      table[lVar4].bits = ((byte)lVar4 & 1) + 1;
    }
    table[1].value = val[1];
    table[3].value = val[2];
    table[5].value = val[1];
    table[7].value = val[3];
    table[3].bits = '\x03';
    table[7].bits = '\x03';
    uVar10 = 8;
  }
  for (; (uint32_t)uVar10 != uVar7; uVar10 = (ulong)((uint32_t)uVar10 * 2)) {
    memcpy(table + uVar10,table,uVar10 << 2);
  }
  return uVar7;
}

Assistant:

uint32_t BrotliBuildSimpleHuffmanTable(HuffmanCode* table,
                                       int root_bits,
                                       uint16_t* val,
                                       uint32_t num_symbols) {
  uint32_t table_size = 1;
  const uint32_t goal_size = 1U << root_bits;
  switch (num_symbols) {
    case 0:
      table[0].bits = 0;
      table[0].value = val[0];
      break;
    case 1:
      table[0].bits = 1;
      table[1].bits = 1;
      if (val[1] > val[0]) {
        table[0].value = val[0];
        table[1].value = val[1];
      } else {
        table[0].value = val[1];
        table[1].value = val[0];
      }
      table_size = 2;
      break;
    case 2:
      table[0].bits = 1;
      table[0].value = val[0];
      table[2].bits = 1;
      table[2].value = val[0];
      if (val[2] > val[1]) {
        table[1].value = val[1];
        table[3].value = val[2];
      } else {
        table[1].value = val[2];
        table[3].value = val[1];
      }
      table[1].bits = 2;
      table[3].bits = 2;
      table_size = 4;
      break;
    case 3: {
      int i, k;
      for (i = 0; i < 3; ++i) {
        for (k = i + 1; k < 4; ++k) {
          if (val[k] < val[i]) {
            uint16_t t = val[k];
            val[k] = val[i];
            val[i] = t;
          }
        }
      }
      for (i = 0; i < 4; ++i) {
        table[i].bits = 2;
      }
      table[0].value = val[0];
      table[2].value = val[1];
      table[1].value = val[2];
      table[3].value = val[3];
      table_size = 4;
      break;
    }
    case 4: {
      int i;
      if (val[3] < val[2]) {
        uint16_t t = val[3];
        val[3] = val[2];
        val[2] = t;
      }
      for (i = 0; i < 7; ++i) {
        table[i].value = val[0];
        table[i].bits = (uint8_t)(1 + (i & 1));
      }
      table[1].value = val[1];
      table[3].value = val[2];
      table[5].value = val[1];
      table[7].value = val[3];
      table[3].bits = 3;
      table[7].bits = 3;
      table_size = 8;
      break;
    }
  }
  while (table_size != goal_size) {
    memcpy(&table[table_size], &table[0],
           (size_t)table_size * sizeof(table[0]));
    table_size <<= 1;
  }
  return goal_size;
}